

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextGLImpl::Flush(DeviceContextGLImpl *this)

{
  long lVar1;
  long lVar2;
  string msg;
  string local_150 [2];
  long local_110 [17];
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject !=
      (RenderPassGLImpl *)0x0) {
    FormatString<char[54]>
              (local_150,(char (*) [54])"Flushing device context inside an active render pass.");
    DebugAssertionFailed
              (local_150[0]._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x604);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150[0]._M_dataplus._M_p != &local_150[0].field_2) {
      operator_delete(local_150[0]._M_dataplus._M_p,local_150[0].field_2._M_allocated_capacity + 1);
    }
  }
  glFlush();
  lVar2 = 0;
  memset(local_150,0,0x124);
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[0] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[1] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[2] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[3] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[4] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[5] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[6] =
       (ShaderResourceCacheGL *)0x0;
  (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[7] =
       (ShaderResourceCacheGL *)0x0;
  do {
    lVar1 = *(long *)((long)local_110 + lVar2);
    if (*(long *)((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].
                         m_pRefCounters + lVar2) != lVar1) {
      RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
                 ((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].
                         m_pRefCounters + lVar2));
      *(undefined8 *)
       ((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].m_pObject + lVar2)
           = *(undefined8 *)((long)local_110 + lVar2 + 8);
      *(long *)((long)&(this->m_BindInfo).super_CommittedShaderResources.SRBs._M_elems[0].
                       m_pRefCounters + lVar2) = lVar1;
      *(undefined8 *)((long)local_110 + lVar2) = 0;
      *(undefined8 *)((long)local_110 + lVar2 + 8) = 0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  (this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated = (bool)(undefined1)local_70;
  (this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask = local_70._1_1_;
  (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask = local_70._2_1_;
  (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask = local_70._3_1_;
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 4) =
       local_80;
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 6) =
       uStack_78;
  *(long *)(this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems =
       local_110[0x10];
  *(undefined8 *)((this->m_BindInfo).super_CommittedShaderResources.CacheRevisions._M_elems + 2) =
       uStack_88;
  *(undefined8 *)&(this->m_BindInfo).super_CommittedShaderResources.field_0xe4 = local_6c;
  *(undefined8 *)&(this->m_BindInfo).field_0xec = uStack_64;
  *(undefined8 *)&(this->m_BindInfo).field_0xf4 = local_5c;
  *(undefined8 *)&(this->m_BindInfo).field_0xfc = uStack_54;
  *(undefined8 *)&(this->m_BindInfo).field_0x104 = local_4c;
  *(undefined8 *)&(this->m_BindInfo).field_0x10c = uStack_44;
  *(undefined8 *)&(this->m_BindInfo).field_0x114 = local_3c;
  *(undefined8 *)&(this->m_BindInfo).field_0x11c = uStack_34;
  lVar2 = 0xb0;
  do {
    RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
               ((long)&local_150[0]._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0x30);
  return;
}

Assistant:

void DeviceContextGLImpl::Flush()
{
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Flushing device context inside an active render pass.");

    glFlush();

    m_BindInfo = {};
}